

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  _Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false> *this_00;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
  _Var1;
  bool bVar2;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
  _Var3;
  
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                        super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                        _M_head_impl.impl_ + 0x18))();
  bVar2 = ParamIterator<aom_rc_mode>::operator!=
                    ((ParamIterator<aom_rc_mode> *)&this->current_,
                     (ParamIterator<aom_rc_mode> *)&this->end_);
  if (!bVar2) {
    ParamIterator<aom_rc_mode>::operator=
              ((ParamIterator<aom_rc_mode> *)&this->current_,
               (ParamIterator<aom_rc_mode> *)&this->begin_);
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
                          ._M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
                + 0x18))();
    bVar2 = ParamIterator<(anonymous_namespace)::uniformTileConfigParam>::operator==
                      (&(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
                        ._M_head_impl,
                       &(this->end_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
                        ._M_head_impl);
    if (bVar2) {
      _Var3.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
      ._M_head_impl =
           (_Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
            )(**(code **)(*(long *)(this->begin_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
                         + 0x20))();
      _Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
      ._M_head_impl =
           (this->current_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
           .
           super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
           .
           super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
           .
           super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
           ._M_head_impl.impl_._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
      ;
      (this->current_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
           = _Var3.
             super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
             ._M_head_impl;
      if (_Var1.
          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
          ._M_head_impl !=
          (ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam> *)0x0) {
        (**(code **)(*(long *)_Var1.
                              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
                              ._M_head_impl + 8))();
      }
      this_00 = &(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
      ;
      (**(code **)(*(long *)(this->current_).
                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                            .
                            super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                            .
                            super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                            ._M_head_impl.impl_._M_t.
                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                            .
                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                  + 0x18))();
      bVar2 = ParamIterator<libaom_test::TestMode>::operator!=
                        (&this_00->_M_head_impl,
                         &(this->end_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                          ._M_head_impl);
      if (!bVar2) {
        ParamIterator<libaom_test::TestMode>::operator=
                  (&this_00->_M_head_impl,
                   &(this->begin_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .
                    super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                    ._M_head_impl);
        (**(code **)(*(long *)(this->current_).
                              super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                              .
                              super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                              ._M_head_impl.impl_._M_t.
                              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                              .
                              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                    + 0x18))();
        ParamIterator<const_libaom_test::CodecFactory_*>::operator!=
                  (&(this->current_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .
                    super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                    ._M_head_impl,
                   &(this->end_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .
                    super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                    ._M_head_impl);
      }
    }
  }
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }